

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,ConfigData *config)

{
  const_reference pvVar1;
  undefined1 local_b0 [8];
  Parser parser;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  string local_70 [32];
  long local_50;
  size_t lastSlash;
  string processName;
  ConfigData *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  std::__cxx11::string::string((string *)&lastSlash,(string *)pvVar1);
  local_50 = std::__cxx11::string::find_last_of((char *)&lastSlash,0x1d14b6);
  if (local_50 != -1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&lastSlash);
    std::__cxx11::string::operator=((string *)&lastSlash,local_70);
    std::__cxx11::string::~string(local_70);
  }
  Detail::BoundArgFunction<Catch::ConfigData>::set
            (&this->m_boundProcessName,config,(string *)&lastSlash);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.inQuotes);
  Parser::Parser((Parser *)local_b0);
  Parser::parseIntoTokens
            ((Parser *)local_b0,args,
             (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.inQuotes);
  populate(__return_storage_ptr__,this,
           (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
           &parser.inQuotes,config);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.inQuotes);
  std::__cxx11::string::~string((string *)&lastSlash);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> parseInto( std::vector<std::string> const& args, ConfigT& config ) const {
            std::string processName = args[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( args, tokens );
            return populate( tokens, config );
        }